

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_MESH_OBJECT
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  bool bVar3;
  bool bVar4;
  ON_MeshFace *pOVar5;
  size_t sVar6;
  int iVar7;
  ON_Mesh *this_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int point_count;
  int face_count;
  int boolHasTexCoordsAsInt;
  int boolHasVertexNormalsAsInt;
  char xyz_1 [3];
  ON_3dVector d;
  unsigned_short xyz [3];
  ON__UINT32 tcode;
  ON_BoundingBox bbox;
  ON__INT64 big_value;
  ON__INT32 local_d8;
  ON__INT32 local_d4;
  ON__INT32 local_d0;
  ON__INT32 local_cc;
  ON_3fPoint local_c8;
  undefined1 local_b8 [8];
  float fStack_b0;
  int iStack_ac;
  double local_a8;
  int local_94;
  int local_90;
  uint local_8c;
  ushort local_88;
  uint local_84;
  double local_80;
  ON_BoundingBox local_78;
  undefined1 local_48 [16];
  ON__INT64 local_38;
  
  local_84 = 0;
  local_38 = 0;
  bVar3 = BeginRead3dmBigChunk(this,&local_84,&local_38);
  if (!bVar3) {
    return false;
  }
  bVar3 = false;
  if (local_84 == 0x100017) {
    local_d8 = 0;
    local_d4 = 0;
    local_cc = 0;
    local_d0 = 0;
    ON_BoundingBox::ON_BoundingBox(&local_78);
    bVar4 = ReadInt32(this,1,&local_d8);
    if (bVar4) {
      this_00 = (ON_Mesh *)0x0;
      if (local_d8 < 1) goto LAB_003a7497;
      bVar4 = ReadInt32(this,1,&local_d4);
      this_00 = (ON_Mesh *)0x0;
      bVar3 = false;
      if ((!bVar4) || (local_d4 < 1)) goto LAB_003a7497;
      bVar3 = ReadInt32(this,1,&local_cc);
      if ((!bVar3) ||
         (((bVar3 = ReadInt32(this,1,&local_d0), !bVar3 ||
           (bVar3 = ReadDouble(this,3,(double *)&local_78), !bVar3)) ||
          (bVar3 = ReadDouble(this,3,&local_78.m_max.x), !bVar3)))) goto LAB_003a7494;
      local_90 = local_cc;
      bVar3 = local_cc != 0;
      local_94 = local_d0;
      bVar4 = local_d0 != 0;
      this_00 = (ON_Mesh *)operator_new(0x6e0);
      ON_Mesh::ON_Mesh(this_00,local_d4,local_d8,bVar3,bVar4);
      ON_BoundingBox::Diagonal((ON_3dVector *)local_b8,&local_78);
      if (0 < local_d8) {
        auVar10._4_4_ = local_b8._4_4_;
        auVar10._0_4_ = local_b8._0_4_;
        auVar10._8_4_ = fStack_b0;
        auVar10._12_4_ = iStack_ac;
        local_48 = divpd(auVar10,_DAT_0069b190);
        local_80 = local_a8 / 65535.0;
        iVar7 = 0;
        do {
          bVar3 = ReadInt16(this,3,(ON__INT16 *)&local_8c);
          if (!bVar3) break;
          auVar8._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
          auVar8._4_2_ = (short)(local_8c >> 0x10);
          auVar8._0_4_ = local_8c;
          local_c8.x = (float)((double)(local_8c & 0xffff) * (double)local_48._0_8_ +
                              (double)CONCAT71(local_78.m_min.x._1_7_,local_78.m_min.x._0_1_));
          local_c8.y = (float)((double)auVar8._4_4_ * (double)local_48._8_8_ + local_78.m_min.y);
          local_c8.z = (float)((double)local_88 * local_80 + local_78.m_min.z);
          ON_SimpleArray<ON_3fPoint>::Append
                    (&(this_00->m_V).super_ON_SimpleArray<ON_3fPoint>,&local_c8);
          iVar7 = iVar7 + 1;
        } while (iVar7 < local_d8);
      }
      if ((this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count == local_d8) {
        if (local_d8 < 0xffff) {
          if (0 < local_d4) {
            iVar7 = 0;
            do {
              bVar3 = ReadInt16(this,4,(ON__INT16 *)local_b8);
              if (!bVar3) break;
              pOVar5 = ON_SimpleArray<ON_MeshFace>::AppendNew(&this_00->m_F);
              auVar1._8_4_ = 0;
              auVar1._0_8_ = CONCAT44(local_b8._4_4_,local_b8._0_4_);
              auVar1._12_2_ = SUB42(local_b8._4_4_,2);
              auVar2._8_2_ = (short)local_b8._4_4_;
              auVar2._0_8_ = CONCAT44(local_b8._4_4_,local_b8._0_4_);
              auVar2._10_4_ = auVar1._10_4_;
              auVar9._6_10_ = SUB1610(ZEXT616(auVar2._8_6_) << 0x40,6);
              auVar9._4_2_ = SUB42(local_b8._0_4_,2);
              auVar9._0_4_ = local_b8._0_4_ & 0xffff;
              *(undefined1 (*) [16])pOVar5->vi = auVar9;
              iVar7 = iVar7 + 1;
            } while (iVar7 < local_d4);
          }
        }
        else if (0 < local_d4) {
          iVar7 = 0;
          do {
            bVar3 = ReadInt32(this,4,(ON__INT32 *)local_b8);
            if (!bVar3) break;
            pOVar5 = ON_SimpleArray<ON_MeshFace>::AppendNew(&this_00->m_F);
            pOVar5->vi[0] = local_b8._0_4_;
            pOVar5->vi[1] = local_b8._4_4_;
            pOVar5->vi[2] = (int)fStack_b0;
            pOVar5->vi[3] = iStack_ac;
            iVar7 = iVar7 + 1;
          } while (iVar7 < local_d4);
        }
        if ((this_00->m_F).m_count == local_d4) {
          if (local_90 != 0) {
            if (0 < local_d8) {
              iVar7 = 0;
              do {
                sVar6 = Read(this,3,&local_c8);
                if (sVar6 != 3) break;
                auVar10 = ZEXT416(CONCAT22(CONCAT11(local_c8.x._1_1_,local_c8.x._1_1_),
                                           CONCAT11(local_c8.x._0_1_,local_c8.x._0_1_)));
                auVar10 = pshuflw(auVar10,auVar10,0x60);
                auVar11._0_8_ = (double)(auVar10._0_4_ >> 0x18);
                auVar11._8_8_ = (double)(auVar10._4_4_ >> 0x18);
                auVar10 = divpd(auVar11,_DAT_0069b1a0);
                local_b8._0_4_ = (undefined4)auVar10._0_8_;
                local_b8._4_4_ = (undefined4)auVar10._8_8_;
                fStack_b0 = (float)(int)local_c8.x._2_1_ / 127.0;
                ON_SimpleArray<ON_3fVector>::Append
                          (&(this_00->m_N).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)local_b8
                          );
                iVar7 = iVar7 + 1;
              } while (iVar7 < local_d8);
            }
            if ((this_00->m_N).super_ON_SimpleArray<ON_3fVector>.m_count !=
                (this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) goto LAB_003a76d9;
          }
          if (local_94 != 0) {
            if (0 < local_d8) {
              iVar7 = 0;
              do {
                bVar3 = ReadInt16(this,2,(ON__INT16 *)&local_c8);
                if (!bVar3) break;
                auVar12._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
                auVar12._4_2_ = local_c8.x._2_2_;
                auVar12._0_4_ = local_c8.x;
                auVar13._0_8_ = (double)((uint)local_c8.x & 0xffff);
                auVar13._8_8_ = (double)auVar12._4_4_;
                auVar10 = divpd(auVar13,_DAT_0069b190);
                local_b8._0_4_ = (undefined4)auVar10._0_8_;
                local_b8._4_4_ = (undefined4)auVar10._8_8_;
                ON_SimpleArray<ON_2fPoint>::Append
                          (&(this_00->m_T).super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)local_b8);
                iVar7 = iVar7 + 1;
              } while (iVar7 < local_d8);
            }
            if ((this_00->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count !=
                (this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) goto LAB_003a76d9;
          }
          bVar3 = true;
          goto LAB_003a7497;
        }
      }
LAB_003a76d9:
      bVar3 = false;
      goto LAB_003a7497;
    }
  }
LAB_003a7494:
  bVar3 = false;
  this_00 = (ON_Mesh *)0x0;
LAB_003a7497:
  bVar4 = EndRead3dmChunk(this,false);
  if (((this_00 != (ON_Mesh *)0x0) && (bVar3)) && (bVar4)) {
    *ppObject = (ON_Object *)this_00;
    local_78.m_min.x._0_1_ = 0;
    Read3dmV1AttributesOrMaterial
              (this,pAttributes,(ON_Material *)0x0,(bool *)&local_78,0xffffffff,
               (ON__3dmV1_XDATA *)0x0);
    return true;
  }
  if (this_00 != (ON_Mesh *)0x0) {
    (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_MESH_OBJECT(
                                                ON_Object** ppObject,
                                                ON_3dmObjectAttributes* pAttributes
                                                )
{
  ON_Mesh* mesh = 0;
  bool rc = false;
  // read v1 mesh
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  int i;
  if ( !BeginRead3dmBigChunk(&tcode,&big_value) )
    return false;
  
  if ( tcode == TCODE_COMPRESSED_MESH_GEOMETRY ) for(;;) 
  {
    
    int point_count = 0;
    int face_count = 0;
    int boolHasVertexNormalsAsInt = false;
    int boolHasTexCoordsAsInt = false;
    ON_BoundingBox bbox;
    
    if (!ReadInt(&point_count) )
      break;
    if ( point_count <= 0 )
      break;
    if (!ReadInt(&face_count) )
      break;
    if ( face_count <= 0 )
      break;
    if (!ReadInt(&boolHasVertexNormalsAsInt) )
      break;
    if (!ReadInt(&boolHasTexCoordsAsInt) )
      break;
    if ( !ReadPoint(bbox.m_min) )
      break;
    if ( !ReadPoint(bbox.m_max) )
      break;

    const bool bHasVertexNormals = boolHasVertexNormalsAsInt ? true : false;
    const bool bHasTexCoords = boolHasTexCoordsAsInt ? true : false;

    mesh = new ON_Mesh(face_count,
                       point_count,
                       bHasVertexNormals,
                       bHasTexCoords
                       );

    // read 3d vertex locations
    {
      ON_3dVector d = bbox.Diagonal();
      double dx = d.x / 65535.0;
      double dy = d.y / 65535.0;
      double dz = d.z / 65535.0;
      unsigned short xyz[3];
      ON_3fPoint pt;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadShort(3,xyz) )
          break;
        pt.x = (float)(dx*xyz[0] + bbox.m_min.x);
        pt.y = (float)(dy*xyz[1] + bbox.m_min.y);
        pt.z = (float)(dz*xyz[2] + bbox.m_min.z);
        mesh->m_V.Append(pt);
      }
    }
    if ( mesh->m_V.Count() != point_count )
      break;

    // read triangle/quadrangle faces
    if ( point_count < 65535 ) {
      unsigned short abcd[4];
      for ( i = 0; i < face_count; i++ ) {
        if ( !ReadShort(4,abcd) )
          break;
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = abcd[0];
        f.vi[1] = abcd[1];
        f.vi[2] = abcd[2];
        f.vi[3] = abcd[3];
      }
    }
    else {
      int abcd[4];
      for ( i = 0; i < face_count; i++ ) {
        if ( !ReadInt(4,abcd) )
          break;
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = abcd[0];
        f.vi[1] = abcd[1];
        f.vi[2] = abcd[2];
        f.vi[3] = abcd[3];
      }
    }
    if ( mesh->m_F.Count() != face_count )
      break;

    if ( bHasVertexNormals ) {
      char xyz[3];
      ON_3fVector normal;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadChar(3,xyz) )
          break;
        normal.x = (float)(((signed char)xyz[0])/127.0);
        normal.y = (float)(((signed char)xyz[1])/127.0);
        normal.z = (float)(((signed char)xyz[2])/127.0);
        mesh->m_N.Append(normal);
      }
      if ( mesh->m_N.Count() != mesh->m_V.Count() )
        break;
    }

    if ( bHasTexCoords ) {
      unsigned short uv[2];
      ON_2fPoint t;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadShort(2,uv) )
          break;
        t.x = (float)(uv[0]/65535.0);
        t.y = (float)(uv[1]/65535.0);
        mesh->m_T.Append(t);
      }
      if ( mesh->m_T.Count() != mesh->m_V.Count() )
        break;
    }

    rc = true;

    break;
  }
  
  if ( !EndRead3dmChunk() )
    rc = false;

  if ( rc && mesh ) {
    *ppObject = mesh;
  }
  else {
    if ( mesh )
      delete mesh;
    rc = false;
  }

  if ( rc && mesh ) {
    // attributes and material information follows the TCODE_COMPRESSED_MESH_GEOMETRY chunk;
    bool bHaveMat = false;
    Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_ENDOFTABLE);
  }

  return rc;
}